

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Time __thiscall helics::Federate::requestTimeComplete(Federate *this)

{
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  handle asyncInfo;
  Modes exp;
  TimeRepresentation<count_time<9,_long>_> newTime;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *in_stack_ffffffffffffff88;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  char *in_stack_ffffffffffffff98;
  undefined1 iterating;
  Federate *in_stack_ffffffffffffffa8;
  Time in_stack_ffffffffffffffb0;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_30;
  undefined1 local_11;
  baseType local_8;
  
  local_11 = 7;
  bVar1 = std::atomic<helics::Federate::Modes>::compare_exchange_strong
                    ((atomic<helics::Federate::Modes> *)in_stack_ffffffffffffffb0.internalTimeCode,
                     (Modes *)in_stack_ffffffffffffffa8,(Modes)((ulong)in_RDI >> 0x38),
                     (memory_order)in_RDI);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffff98);
    message._M_str = (char *)in_stack_ffffffffffffffb0.internalTimeCode;
    message._M_len = (size_t)in_stack_ffffffffffffffa8;
    InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)in_RDI,message);
    __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
  }
  std::
  unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
  ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                *)0x210827);
  iterating = (undefined1)((ulong)in_RDI >> 0x38);
  this_00 = &local_30;
  gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock
            (in_stack_ffffffffffffff88);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(this_00);
  local_8 = (baseType)
            std::future<TimeRepresentation<count_time<9,_long>_>_>::get
                      ((future<TimeRepresentation<count_time<9,_long>_>_> *)
                       in_stack_ffffffffffffffa8);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::unlock(this_00);
  postTimeRequestOperations(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,(bool)iterating);
  gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
            ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x210893);
  return (Time)local_8;
}

Assistant:

Time Federate::requestTimeComplete()
{
    auto exp = Modes::PENDING_TIME;
    if (currentMode.compare_exchange_strong(exp, Modes::EXECUTING)) {
        auto asyncInfo = asyncCallInfo->lock();
        auto newTime = asyncInfo->timeRequestFuture.get();
        asyncInfo.unlock();  // remove the lock;
        postTimeRequestOperations(newTime, false);
        return newTime;
    }
    throw(InvalidFunctionCall(
        "cannot call requestTimeComplete without first calling requestTimeAsync function"));
}